

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O2

void __thiscall
FastPForLib::FastBinaryPacking<32U>::encodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint32_t uVar1;
  uint32_t i;
  uint32_t *puVar2;
  long lVar3;
  uint32_t *out_00;
  uint32_t Bs [4];
  uint32_t local_78 [3];
  uint local_6c;
  uint32_t *local_60;
  size_t *local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  local_58 = nvalue;
  checkifdivisibleby(length,0x80);
  out_00 = out + 1;
  local_60 = out;
  *out = (uint32_t)length;
  local_50 = in + length;
  while (in + 0x80 <= local_50) {
    local_48 = in + 0x80;
    puVar2 = in;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      local_40 = puVar2 + 0x20;
      local_38 = puVar2;
      uVar1 = maxbits<unsigned_int_const*>(&local_38,&local_40);
      local_78[lVar3] = uVar1;
      puVar2 = puVar2 + 0x20;
    }
    *out_00 = local_78[2] << 8 | local_78[1] << 0x10 | local_78[0] << 0x18 | local_6c;
    out_00 = out_00 + 1;
    puVar2 = in;
    for (lVar3 = 0; in = local_48, lVar3 != 4; lVar3 = lVar3 + 1) {
      fastpackwithoutmask(puVar2,out_00,local_78[lVar3]);
      puVar2 = puVar2 + 0x20;
      out_00 = out_00 + local_78[lVar3];
    }
  }
  *local_58 = (long)out_00 - (long)local_60 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }